

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_fsm.cc
# Opt level: O0

void init_fsm(module *m)

{
  class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *pcVar1;
  class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *pcVar2;
  code *local_438;
  undefined8 local_430;
  code *local_428;
  undefined8 local_420;
  offset_in_Var_to_subr local_410 [2];
  code *local_400;
  undefined8 local_3f8;
  offset_in_Var_to_subr local_3e8 [2];
  code *local_3d8;
  undefined8 local_3d0;
  offset_in_Var_to_subr local_3c0 [2];
  code *local_3b0;
  undefined8 local_3a8;
  offset_in_Var_to_subr local_398 [2];
  code *local_388;
  undefined8 local_380;
  offset_in_Var_to_subr local_370 [2];
  code *local_360;
  undefined8 local_358;
  offset_in_Var_to_subr local_348 [2];
  PyObject *local_338;
  class_<kratos::FSMState,_std::shared_ptr<kratos::FSMState>_> local_330;
  code *local_328;
  undefined8 local_320;
  code *local_318;
  undefined8 local_310;
  return_value_policy local_301;
  code *local_300;
  undefined8 local_2f8;
  code *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  undefined8 local_2d8;
  code *local_2d0;
  undefined8 local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  code *local_2b0;
  undefined8 local_2a8;
  offset_in_Var_to_subr local_298 [2];
  code *local_288;
  undefined8 local_280;
  offset_in_Var_to_subr local_270 [2];
  code *local_260;
  undefined8 local_258;
  offset_in_Var_to_subr local_248 [2];
  code *local_238;
  undefined8 local_230;
  offset_in_Var_to_subr local_220 [2];
  code *local_210;
  undefined8 local_208;
  code *local_200;
  undefined8 local_1f8;
  code *local_1f0;
  undefined8 local_1e8;
  offset_in_Var_to_subr local_1d8 [2];
  code *local_1c8;
  undefined8 local_1c0;
  offset_in_Var_to_subr local_1b0 [2];
  code *local_1a0;
  undefined8 local_198;
  offset_in_Var_to_subr local_188 [2];
  code *local_178;
  undefined8 local_170;
  offset_in_Var_to_subr local_160 [2];
  code *local_150;
  undefined8 local_148;
  offset_in_Var_to_subr local_138 [2];
  code *local_128;
  undefined8 local_120;
  offset_in_Var_to_subr local_110 [2];
  code *local_100;
  undefined8 local_f8;
  offset_in_Var_to_subr local_e8 [2];
  code *local_d8;
  undefined8 local_d0;
  offset_in_Var_to_subr local_c0 [2];
  return_value_policy local_a9;
  code *local_a8;
  undefined8 local_a0;
  return_value_policy local_91;
  code *local_90;
  undefined8 local_88;
  offset_in_Var_to_subr local_78 [2];
  return_value_policy local_61;
  code *local_60;
  undefined8 local_58;
  offset_in_Var_to_subr local_48 [2];
  constructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::shared_ptr<kratos::Var>,_std::shared_ptr<kratos::Var>_>
  local_36 [21];
  constructor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>
  local_21;
  PyObject *local_20;
  class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> local_18;
  module *local_10;
  module *m_local;
  
  local_20 = (m->super_object).super_handle.m_ptr;
  local_10 = m;
  pybind11::class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_>::class_<>
            (&local_18,(handle)local_20,"FSM");
  pybind11::init<std::__cxx11::string,kratos::Generator*>();
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string,kratos::Generator*>
                     ((class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)&local_18,&local_21);
  pybind11::
  init<std::__cxx11::string,kratos::Generator*,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
            ();
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string,kratos::Generator*,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
                     (pcVar1,local_36);
  local_60 = kratos::FSM::add_state;
  local_58 = 0;
  local_48[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                          ((overload_cast_impl<std::__cxx11::string_const&> *)
                           &pybind11::overload_cast<std::__cxx11::string_const&>,
                           kratos::FSM::add_state,0);
  local_61 = reference;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
                     (pcVar1,"add_state",local_48,&local_61);
  local_90 = kratos::FSM::add_state;
  local_88 = 0;
  local_78[0] = pybind11::detail::
                overload_cast_impl<std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                ::operator()(&pybind11::
                              overload_cast<std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                             ,kratos::FSM::add_state,0);
  local_91 = reference;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&),pybind11::return_value_policy>
                     (pcVar1,"add_state",local_78,&local_91);
  local_a8 = kratos::FSM::get_state;
  local_a0 = 0;
  local_a9 = reference;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&)const,pybind11::return_value_policy>
                     (pcVar1,"get_state",(offset_in_Var_to_subr *)&local_a8,&local_a9);
  local_d8 = kratos::FSM::set_start_state;
  local_d0 = 0;
  local_c0[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                          ((overload_cast_impl<std::__cxx11::string_const&> *)
                           &pybind11::overload_cast<std::__cxx11::string_const&>,
                           kratos::FSM::set_start_state,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>(pcVar1,"set_start_state",local_c0)
  ;
  local_100 = kratos::FSM::set_start_state;
  local_f8 = 0;
  local_e8[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::FSMState>const&>::
                operator()(&pybind11::overload_cast<std::shared_ptr<kratos::FSMState>const&>,
                           kratos::FSM::set_start_state,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::FSMState>const&)>
                     (pcVar1,"set_start_state",local_e8);
  local_128 = kratos::FSM::set_start_state;
  local_120 = 0;
  local_110[0] = pybind11::detail::
                 overload_cast_impl<std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                              ,kratos::FSM::set_start_state,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar1,"set_start_state",local_110);
  local_150 = kratos::FSM::set_start_state;
  local_148 = 0;
  local_138[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::FSMState>const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::FSMState>const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                              ,kratos::FSM::set_start_state,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::FSMState>const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar1,"set_start_state",local_138);
  local_178 = kratos::FSM::output;
  local_170 = 0;
  local_160[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                           ((overload_cast_impl<std::__cxx11::string_const&> *)
                            &pybind11::overload_cast<std::__cxx11::string_const&>,
                            kratos::FSM::output,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>(pcVar1,"output",local_160);
  local_1a0 = kratos::FSM::output;
  local_198 = 0;
  local_188[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Var>const&>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Var>const&>,
                            kratos::FSM::output,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::Var>const&)>(pcVar1,"output",local_188);
  local_1c8 = kratos::FSM::output;
  local_1c0 = 0;
  local_1b0[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
                              ,kratos::FSM::output,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&)>
                     (pcVar1,"output",local_1b0);
  local_1f0 = kratos::FSM::output;
  local_1e8 = 0;
  local_1d8[0] = pybind11::detail::
                 overload_cast_impl<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&>
                              ,kratos::FSM::output,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&)>
                     (pcVar1,"output",local_1d8);
  local_200 = kratos::FSM::fsm_name_abi_cxx11_;
  local_1f8 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string_const&(kratos::FSM::*)()const>
                     (pcVar1,"fsm_name",(offset_in_Var_to_subr *)&local_200);
  local_210 = kratos::FSM::outputs;
  local_208 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::unordered_map<kratos::Var*,kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>const&(kratos::FSM::*)()const>
                     (pcVar1,"outputs",(offset_in_Var_to_subr *)&local_210);
  local_238 = kratos::FSM::dot_graph_abi_cxx11_;
  local_230 = 0;
  local_220[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            kratos::FSM::dot_graph_abi_cxx11_,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string(kratos::FSM::*)()>(pcVar1,"dot_graph",local_220);
  local_260 = kratos::FSM::dot_graph;
  local_258 = 0;
  local_248[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                           ((overload_cast_impl<std::__cxx11::string_const&> *)
                            &pybind11::overload_cast<std::__cxx11::string_const&>,
                            kratos::FSM::dot_graph,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>(pcVar1,"dot_graph",local_248);
  local_288 = kratos::FSM::output_table_abi_cxx11_;
  local_280 = 0;
  local_270[0] = pybind11::detail::overload_cast_impl<>::operator()
                           ((overload_cast_impl<> *)&pybind11::overload_cast<>,
                            kratos::FSM::output_table_abi_cxx11_,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string(kratos::FSM::*)()>(pcVar1,"output_table",local_270);
  local_2b0 = kratos::FSM::output_table;
  local_2a8 = 0;
  local_298[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&>::operator()
                           ((overload_cast_impl<std::__cxx11::string_const&> *)
                            &pybind11::overload_cast<std::__cxx11::string_const&>,
                            kratos::FSM::output_table,0);
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>(pcVar1,"output_table",local_298);
  local_2c0 = kratos::FSM::set_moore;
  local_2b8 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(bool)>(pcVar1,"set_moore",(offset_in_Var_to_subr *)&local_2c0);
  local_2d0 = kratos::FSM::is_moore;
  local_2c8 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<bool(kratos::FSM::*)()const>(pcVar1,"is_moore",(offset_in_Var_to_subr *)&local_2d0);
  local_2e0 = kratos::FSM::add_child_fsm;
  local_2d8 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(kratos::FSM*)>
                     (pcVar1,"add_child_fsm",(offset_in_Var_to_subr *)&local_2e0);
  local_2f0 = kratos::FSM::get_all_child_fsm;
  local_2e8 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::vector<kratos::FSM*,std::allocator<kratos::FSM*>>(kratos::FSM::*)()const>
                     (pcVar1,"get_all_child_fsm",(offset_in_Var_to_subr *)&local_2f0);
  local_300 = kratos::FSM::current_state_var;
  local_2f8 = 0;
  local_301 = reference;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def_property_readonly<kratos::EnumVar*(kratos::FSM::*)()const,pybind11::return_value_policy>
                     (pcVar1,"current_state",(offset_in_Var_to_subr *)&local_300,&local_301);
  local_318 = kratos::FSM::realize;
  local_310 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::def<void(kratos::FSM::*)()>
                     (pcVar1,"realize",(offset_in_Var_to_subr *)&local_318);
  local_328 = kratos::FSM::set_reset_high;
  local_320 = 0;
  pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::def<void(kratos::FSM::*)(bool)>
            (pcVar1,"set_reset_high",(offset_in_Var_to_subr *)&local_328);
  pybind11::class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_>::~class_(&local_18);
  local_338 = (local_10->super_object).super_handle.m_ptr;
  pybind11::class_<kratos::FSMState,_std::shared_ptr<kratos::FSMState>_>::class_<>
            (&local_330,(handle)local_338,"FSMState");
  local_360 = kratos::FSMState::next;
  local_358 = 0;
  local_348[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&>
                              ,kratos::FSMState::next,0);
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&)>
                     ((class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)&local_330,
                      "next",local_348);
  local_388 = kratos::FSMState::next;
  local_380 = 0;
  local_370[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                              ,kratos::FSMState::next,0);
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar2,"next",local_370);
  local_3b0 = kratos::FSMState::output;
  local_3a8 = 0;
  local_398[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&>
                              ,kratos::FSMState::output,0);
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&)>
                     (pcVar2,"output",local_398);
  local_3d8 = kratos::FSMState::output;
  local_3d0 = 0;
  local_3c0[0] = pybind11::detail::overload_cast_impl<std::shared_ptr<kratos::Var>const&,long>::
                 operator()(&pybind11::overload_cast<std::shared_ptr<kratos::Var>const&,long>,
                            kratos::FSMState::output,0);
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,long)>
                     (pcVar2,"output",local_3c0);
  local_400 = kratos::FSMState::output;
  local_3f8 = 0;
  local_3e8[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&>
                              ,kratos::FSMState::output,0);
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar2,"output",local_3e8);
  local_428 = kratos::FSMState::output;
  local_420 = 0;
  local_410[0] = pybind11::detail::
                 overload_cast_impl<std::shared_ptr<kratos::Var>const&,long,std::pair<std::__cxx11::string,unsigned_int>const&>
                 ::operator()(&pybind11::
                               overload_cast<std::shared_ptr<kratos::Var>const&,long,std::pair<std::__cxx11::string,unsigned_int>const&>
                              ,kratos::FSMState::output,0);
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,long,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar2,"output",local_410);
  local_438 = kratos::FSMState::name_abi_cxx11_;
  local_430 = 0;
  pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
  def_property_readonly<std::__cxx11::string_const&(kratos::FSMState::*)()const>
            (pcVar2,"name",(offset_in_Var_to_subr *)&local_438);
  pybind11::class_<kratos::FSMState,_std::shared_ptr<kratos::FSMState>_>::~class_(&local_330);
  return;
}

Assistant:

void init_fsm(py::module &m) {
    using namespace kratos;
    py::class_<FSM, std::shared_ptr<FSM>>(m, "FSM")
        .def(py::init<std::string, Generator *>())
        .def(py::init<std::string, Generator *, std::shared_ptr<Var>, std::shared_ptr<Var>>())
        .def("add_state", py::overload_cast<const std::string &>(&FSM::add_state),
             py::return_value_policy::reference)
        .def("add_state",
             py::overload_cast<const std::string &, const std::pair<std::string, uint32_t> &>(
                 &FSM::add_state),
             py::return_value_policy::reference)
        .def("get_state", &FSM::get_state, py::return_value_policy::reference)
        .def("set_start_state", py::overload_cast<const std::string &>(&FSM::set_start_state))
        .def("set_start_state",
             py::overload_cast<const std::shared_ptr<FSMState> &>(&FSM::set_start_state))
        .def("set_start_state",
             py::overload_cast<const std::string &, const std::pair<std::string, uint32_t> &>(
                 &FSM::set_start_state))
        .def("set_start_state",
             py::overload_cast<const std::shared_ptr<FSMState> &,
                               const std::pair<std::string, uint32_t> &>(&FSM::set_start_state))
        .def("output", py::overload_cast<const std::string &>(&FSM::output))
        .def("output", py::overload_cast<const std::shared_ptr<Var> &>(&FSM::output))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, const std::shared_ptr<Var> &>(
                 &FSM::output))
        .def("output",
             py::overload_cast<const std::string &, const std::shared_ptr<Var> &>(&FSM::output))
        .def("fsm_name", &FSM::fsm_name)
        .def("outputs", &FSM::outputs)
        .def("dot_graph", py::overload_cast<>(&FSM::dot_graph))
        .def("dot_graph", py::overload_cast<const std::string &>(&FSM::dot_graph))
        .def("output_table", py::overload_cast<>(&FSM::output_table))
        .def("output_table", py::overload_cast<const std::string &>(&FSM::output_table))
        .def("set_moore", &FSM::set_moore)
        .def("is_moore", &FSM::is_moore)
        .def("add_child_fsm", &FSM::add_child_fsm)
        .def("get_all_child_fsm", &FSM::get_all_child_fsm)
        .def_property_readonly("current_state", &FSM::current_state_var,
                               // don't want Python to free it
                               py::return_value_policy::reference)
        .def("realize", &FSM::realize)
        .def("set_reset_high", &FSM::set_reset_high);

    py::class_<FSMState, std::shared_ptr<FSMState>>(m, "FSMState")
        .def("next",
             py::overload_cast<const std::shared_ptr<FSMState> &, const std::shared_ptr<Var> &>(
                 &FSMState::next))
        .def("next",
             py::overload_cast<const std::shared_ptr<FSMState> &, const std::shared_ptr<Var> &,
                               const std::pair<std::string, uint32_t> &>(&FSMState::next))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, const std::shared_ptr<Var> &>(
                 &FSMState::output))
        .def("output", py::overload_cast<const std::shared_ptr<Var> &, int64_t>(&FSMState::output))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, const std::shared_ptr<Var> &,
                               const std::pair<std::string, uint32_t> &>(&FSMState::output))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, int64_t,
                               const std::pair<std::string, uint32_t> &>(&FSMState::output))
        .def_property_readonly("name", &FSMState::name);
}